

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O0

void llvm::DWARFDebugLoclists::dumpRange
               (DWARFDataExtractor *Data,uint64_t StartOffset,uint64_t Size,uint16_t Version,
               raw_ostream *OS,uint64_t BaseAddr,MCRegisterInfo *MRI,DIDumpOptions DumpOpts)

{
  StringRef Str;
  bool bVar1;
  StringRef local_78;
  char *local_68;
  char *local_60;
  byte local_51;
  undefined1 auStack_50 [7];
  bool CanContinue;
  StringRef Separator;
  uint64_t Offset;
  uint64_t BaseAddr_local;
  raw_ostream *OS_local;
  uint16_t Version_local;
  uint64_t Size_local;
  uint64_t StartOffset_local;
  DWARFDataExtractor *Data_local;
  
  bVar1 = DataExtractor::isValidOffsetForDataOfSize(&Data->super_DataExtractor,StartOffset,Size);
  if (bVar1) {
    Separator.Length = StartOffset;
    StringRef::StringRef((StringRef *)auStack_50);
    local_51 = 1;
    while ((local_51 & 1) != 0 && Separator.Length < StartOffset + Size) {
      local_68 = _auStack_50;
      local_60 = Separator.Data;
      Str.Length = (size_t)Separator.Data;
      Str.Data = _auStack_50;
      raw_ostream::operator<<(OS,Str);
      StringRef::StringRef(&local_78,"\n");
      _auStack_50 = local_78.Data;
      Separator.Data = (char *)local_78.Length;
      local_51 = dumpLocationList(Data,&Separator.Length,Version,OS,BaseAddr,MRI,(DWARFUnit *)0x0,
                                  DumpOpts,0xc);
      raw_ostream::operator<<(OS,'\n');
    }
  }
  else {
    raw_ostream::operator<<(OS,"Invalid dump range\n");
  }
  return;
}

Assistant:

void DWARFDebugLoclists::dumpRange(const DWARFDataExtractor &Data,
                                   uint64_t StartOffset, uint64_t Size,
                                   uint16_t Version, raw_ostream &OS,
                                   uint64_t BaseAddr, const MCRegisterInfo *MRI,
                                   DIDumpOptions DumpOpts) {
  if (!Data.isValidOffsetForDataOfSize(StartOffset, Size))  {
    OS << "Invalid dump range\n";
    return;
  }
  uint64_t Offset = StartOffset;
  StringRef Separator;
  bool CanContinue = true;
  while (CanContinue && Offset < StartOffset + Size) {
    OS << Separator;
    Separator = "\n";

    CanContinue = dumpLocationList(Data, &Offset, Version, OS, BaseAddr, MRI,
                                   nullptr, DumpOpts, /*Indent=*/12);
    OS << '\n';
  }
}